

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aprog.c
# Opt level: O0

void tick_prog_academy_reset(AREA_DATA_conflict *area)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  AREA_DATA_conflict *in_RDI;
  char buf [4608];
  CHAR_DATA *ch;
  char *in_stack_00004a00;
  CHAR_DATA *in_stack_00004a08;
  CHAR_DATA *in_stack_ffffffffffffeda8;
  AREA_DATA_conflict *in_stack_ffffffffffffedb0;
  CHAR_DATA *in_stack_ffffffffffffedb8;
  char *in_stack_ffffffffffffedc0;
  CHAR_DATA *in_stack_ffffffffffffedc8;
  ROOM_INDEX_DATA *in_stack_ffffffffffffedd8;
  char *in_stack_ffffffffffffede0;
  char local_1218 [24];
  CHAR_DATA *in_stack_ffffffffffffee00;
  CHAR_DATA *local_10;
  
  for (local_10 = char_list; local_10 != (CHAR_DATA *)0x0; local_10 = local_10->next) {
    bVar1 = is_npc(in_stack_ffffffffffffeda8);
    if ((((!bVar1) && (local_10->in_room->area == in_RDI)) && (10 < local_10->level)) &&
       ((local_10->fighting == (CHAR_DATA *)0x0 &&
        (bVar1 = is_immortal(in_stack_ffffffffffffeda8), !bVar1)))) {
      send_to_char(in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8);
      act(in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8,in_stack_ffffffffffffedb0,
          in_stack_ffffffffffffeda8,0);
      in_stack_ffffffffffffeda8 = (CHAR_DATA *)local_1218;
      in_stack_ffffffffffffedb0 =
           (AREA_DATA_conflict *)get_char_color(in_stack_ffffffffffffedc8,in_stack_ffffffffffffedc0)
      ;
      pcVar3 = END_COLOR(in_stack_ffffffffffffedb8);
      sprintf((char *)in_stack_ffffffffffffeda8,
              "A Royal Academy Guard says \'%sBy the orders of the King, you have completed your training and must depart.%s\'\n\r"
              ,in_stack_ffffffffffffedb0,pcVar3);
      send_to_char(in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8);
      send_to_char(in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8);
      do_look(in_stack_00004a08,in_stack_00004a00);
      in_stack_ffffffffffffedb8 = (CHAR_DATA *)local_1218;
      in_stack_ffffffffffffedc0 =
           get_char_color(in_stack_ffffffffffffedc8,in_stack_ffffffffffffedc0);
      pcVar3 = END_COLOR(in_stack_ffffffffffffedb8);
      sprintf((char *)in_stack_ffffffffffffedb8,
              "A Royal Academy Guard says \'%sThe King allows a small reward for the completion of your training here.%s\'\n\r"
              ,in_stack_ffffffffffffedc0,pcVar3);
      send_to_char(in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8);
      send_to_char(in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8);
      local_10->gold = local_10->gold + 0x19;
      char_from_room(in_stack_ffffffffffffee00);
      in_stack_ffffffffffffedc8 = local_10;
      get_room_index((int)((ulong)in_stack_ffffffffffffedb8 >> 0x20));
      char_to_room((CHAR_DATA *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
      in_stack_ffffffffffffedd8 =
           (ROOM_INDEX_DATA *)get_char_color(in_stack_ffffffffffffedc8,in_stack_ffffffffffffedc0);
      bVar1 = is_good(in_stack_ffffffffffffeda8);
      in_stack_ffffffffffffede0 =
           "the parrots in the forest off of the road south of Cimar or the pixies in the Emerald Forest off the Melcene Plains Road"
      ;
      if (bVar1) {
        in_stack_ffffffffffffede0 =
             "the parrots in the forest off of the road south of Cimar or the trolls in the forests off the Great Shalaran Road"
        ;
      }
      pcVar3 = END_COLOR(in_stack_ffffffffffffedb8);
      sprintf(local_1218,
              "A Royal Academy Guard says \'%sA tip from me: if you\'re looking to learn further, I might try %s.%s\'\n\r"
              ,in_stack_ffffffffffffedd8,in_stack_ffffffffffffede0,pcVar3);
      send_to_char(in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8);
    }
  }
  if (((in_RDI->age < 3) || (5 < in_RDI->age)) || (iVar2 = number_percent(), iVar2 < 0x33)) {
    if (5 < in_RDI->age) {
      reset_area(in_stack_ffffffffffffedb0);
    }
  }
  else {
    reset_area(in_stack_ffffffffffffedb0);
  }
  return;
}

Assistant:

void tick_prog_academy_reset(AREA_DATA *area)
{
	CHAR_DATA *ch;

	for (ch = char_list; ch; ch = ch->next)
	{
		if (!is_npc(ch) && ch->in_room->area == area && ch->level > 10 && !ch->fighting && !is_immortal(ch))
		{
			char buf[MSL];

			send_to_char("A small contingent of guards rapidly marches up to you.\n\r", ch);
			act("A small contingent of guards rapidly marches up to $n, marching $m off.", ch, 0, 0, TO_ROOM);

			sprintf(buf, "A Royal Academy Guard says '%sBy the orders of the King, you have completed your training and must depart.%s'\n\r",
				get_char_color(ch, "speech"),
				END_COLOR(ch));
			send_to_char(buf, ch);
			send_to_char("The guards lead you to the exit of the Academy.\n\r", ch);

			do_look(ch, "auto");
			sprintf(buf, "A Royal Academy Guard says '%sThe King allows a small reward for the completion of your training here.%s'\n\r",
				get_char_color(ch, "speech"),
				END_COLOR(ch));
			send_to_char(buf, ch);
			send_to_char("A Royal Academy Guard gives you 25 gold.\n\r", ch);

			ch->gold += 25;

			char_from_room(ch);
			char_to_room(ch, get_room_index(ROOM_VNUM_TEMPLE));

			sprintf(buf, "A Royal Academy Guard says '%sA tip from me: if you're looking to learn further, I might try %s.%s'\n\r",
				get_char_color(ch, "speech"),
				is_good(ch)
					? "the parrots in the forest off of the road south of Cimar or the trolls in the forests off the Great Shalaran Road"
					: "the parrots in the forest off of the road south of Cimar or the pixies in the Emerald Forest off the Melcene Plains Road",
				END_COLOR(ch));
			send_to_char(buf, ch);
		}
	}

	if (area->age > 2 && area->age < 6)
	{
		if (number_percent() > 50)
		{
			reset_area(area);
			return;
		}
	}

	if (area->age >= 6)
		reset_area(area);

	/*
	for ( ch->level = ch->level ; ch->level < 25; ch->level++ )
	{
		advance_level( ch,false);
	}
	ch->exp = exp_per_level(ch) * (ch->level - 1);
	*/
}